

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O0

void __thiscall
FastPForLib::VariableByte::encodeToByteArray<unsigned_long>
          (VariableByte *this,unsigned_long *in,size_t length,uint8_t *bout,size_t *nvalue)

{
  ulong val_00;
  byte bVar1;
  byte *in_RCX;
  ulong in_RDX;
  long in_RSI;
  VariableByte *in_RDI;
  long *in_R8;
  uint64_t val;
  size_t k;
  uint8_t *initbout;
  ulong local_38;
  byte *local_20;
  
  local_20 = in_RCX;
  for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
    val_00 = *(ulong *)(in_RSI + local_38 * 8);
    if (val_00 < 0x80) {
      *local_20 = (byte)val_00 | 0x80;
      local_20 = local_20 + 1;
    }
    else if (val_00 < 0x4000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bitsmaskless<1u>(in_RDI,val_00);
      local_20[1] = bVar1 | 0x80;
      local_20 = local_20 + 2;
    }
    else if (val_00 < 0x200000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bitsmaskless<2u>(in_RDI,val_00);
      local_20[2] = bVar1 | 0x80;
      local_20 = local_20 + 3;
    }
    else if (val_00 < 0x10000000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bitsmaskless<3u>(in_RDI,val_00);
      local_20[3] = bVar1 | 0x80;
      local_20 = local_20 + 4;
    }
    else if (val_00 < 0x800000000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bits<3u>(in_RDI,val_00);
      local_20[3] = bVar1;
      bVar1 = extract7bitsmaskless<4u>(in_RDI,val_00);
      local_20[4] = bVar1 | 0x80;
      local_20 = local_20 + 5;
    }
    else if (val_00 < 0x40000000000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bits<3u>(in_RDI,val_00);
      local_20[3] = bVar1;
      bVar1 = extract7bits<4u>(in_RDI,val_00);
      local_20[4] = bVar1;
      bVar1 = extract7bitsmaskless<5u>(in_RDI,val_00);
      local_20[5] = bVar1 | 0x80;
      local_20 = local_20 + 6;
    }
    else if (val_00 < 0x2000000000000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bits<3u>(in_RDI,val_00);
      local_20[3] = bVar1;
      bVar1 = extract7bits<4u>(in_RDI,val_00);
      local_20[4] = bVar1;
      bVar1 = extract7bits<5u>(in_RDI,val_00);
      local_20[5] = bVar1;
      bVar1 = extract7bitsmaskless<6u>(in_RDI,val_00);
      local_20[6] = bVar1 | 0x80;
      local_20 = local_20 + 7;
    }
    else if (val_00 < 0x100000000000000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bits<3u>(in_RDI,val_00);
      local_20[3] = bVar1;
      bVar1 = extract7bits<4u>(in_RDI,val_00);
      local_20[4] = bVar1;
      bVar1 = extract7bits<5u>(in_RDI,val_00);
      local_20[5] = bVar1;
      bVar1 = extract7bits<6u>(in_RDI,val_00);
      local_20[6] = bVar1;
      bVar1 = extract7bitsmaskless<7u>(in_RDI,val_00);
      local_20[7] = bVar1 | 0x80;
      local_20 = local_20 + 8;
    }
    else if (val_00 < 0x8000000000000000) {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bits<3u>(in_RDI,val_00);
      local_20[3] = bVar1;
      bVar1 = extract7bits<4u>(in_RDI,val_00);
      local_20[4] = bVar1;
      bVar1 = extract7bits<5u>(in_RDI,val_00);
      local_20[5] = bVar1;
      bVar1 = extract7bits<6u>(in_RDI,val_00);
      local_20[6] = bVar1;
      bVar1 = extract7bits<7u>(in_RDI,val_00);
      local_20[7] = bVar1;
      bVar1 = extract7bitsmaskless<8u>(in_RDI,val_00);
      local_20[8] = bVar1 | 0x80;
      local_20 = local_20 + 9;
    }
    else {
      bVar1 = extract7bits<0u>(in_RDI,val_00);
      *local_20 = bVar1;
      bVar1 = extract7bits<1u>(in_RDI,val_00);
      local_20[1] = bVar1;
      bVar1 = extract7bits<2u>(in_RDI,val_00);
      local_20[2] = bVar1;
      bVar1 = extract7bits<3u>(in_RDI,val_00);
      local_20[3] = bVar1;
      bVar1 = extract7bits<4u>(in_RDI,val_00);
      local_20[4] = bVar1;
      bVar1 = extract7bits<5u>(in_RDI,val_00);
      local_20[5] = bVar1;
      bVar1 = extract7bits<6u>(in_RDI,val_00);
      local_20[6] = bVar1;
      bVar1 = extract7bits<7u>(in_RDI,val_00);
      local_20[7] = bVar1;
      bVar1 = extract7bits<8u>(in_RDI,val_00);
      local_20[8] = bVar1;
      bVar1 = extract7bitsmaskless<9u>(in_RDI,val_00);
      local_20[9] = bVar1 | 0x80;
      local_20 = local_20 + 10;
    }
  }
  *in_R8 = (long)local_20 - (long)in_RCX;
  return;
}

Assistant:

void encodeToByteArray(const T *in, const size_t length, uint8_t *bout,
                         size_t &nvalue) {
    const uint8_t *const initbout = bout;
    for (size_t k = 0; k < length; ++k) {
      const uint64_t val = in[k];
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1ULL << 7)) {
        *bout = static_cast<uint8_t>(val | 0x80);
        ++bout;
      } else if (val < (1ULL << 14)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bitsmaskless<1>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 21)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bitsmaskless<2>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 28)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bitsmaskless<3>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 35)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bitsmaskless<4>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 42)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bitsmaskless<5>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 49)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bitsmaskless<6>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 56)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bitsmaskless<7>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 63)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bits<7>(val);
        ++bout;
        *bout = extract7bitsmaskless<8>(val) | 0x80;
        ++bout;
      } else {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bits<7>(val);
        ++bout;
        *bout = extract7bits<8>(val);
        ++bout;
        *bout = extract7bitsmaskless<9>(val) | 0x80;
        ++bout;
      }
    }
    nvalue = bout - initbout;
  }